

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Osc::render(V2Osc *this,float *dest,int nsamples)

{
  int nsamples_local;
  float *dest_local;
  V2Osc *this_local;
  
  switch(this->mode & 7) {
  case 0:
    break;
  case 1:
    renderTriSaw(this,dest,nsamples);
    break;
  case 2:
    renderPulse(this,dest,nsamples);
    break;
  case 3:
    renderSin(this,dest,nsamples);
    break;
  case 4:
    renderNoise(this,dest,nsamples);
    break;
  case 5:
    renderFMSin(this,dest,nsamples);
    break;
  case 6:
    renderAux(this,dest,this->inst->auxabuf,nsamples);
    break;
  case 7:
    renderAux(this,dest,this->inst->auxbbuf,nsamples);
  }
  return;
}

Assistant:

void render(float *dest, int nsamples)
    {
        switch (mode & 7)
        {
        case OSC_OFF:     break;
        case OSC_TRI_SAW: renderTriSaw(dest, nsamples); break;
        case OSC_PULSE:   renderPulse(dest, nsamples); break;
        case OSC_SIN:     renderSin(dest, nsamples); break;
        case OSC_NOISE:   renderNoise(dest, nsamples); break;
        case OSC_FM_SIN:  renderFMSin(dest, nsamples); break;
        case OSC_AUXA:    renderAux(dest, inst->auxabuf, nsamples); break;
        case OSC_AUXB:    renderAux(dest, inst->auxbbuf, nsamples); break;
        }

        DEBUG_PLOT(this, dest, nsamples);
    }